

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::IfConversion::GetIncomingValue
          (IfConversion *this,Instruction *phi,uint32_t predecessor)

{
  uint32_t id;
  DefUseManager *this_00;
  Instruction *pIVar1;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  id = Instruction::GetSingleWordInOperand(phi,predecessor * 2);
  pIVar1 = analysis::DefUseManager::GetDef(this_00,id);
  return pIVar1;
}

Assistant:

Instruction* IfConversion::GetIncomingValue(Instruction* phi,
                                            uint32_t predecessor) {
  uint32_t in_index = 2 * predecessor;
  return get_def_use_mgr()->GetDef(phi->GetSingleWordInOperand(in_index));
}